

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  
  *r = 0;
  uVar1 = 0;
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    uVar1 = (uint)b32[lVar2] | uVar1 << 8;
    if (0xc < uVar1) {
      iVar3 = 1;
      uVar1 = uVar1 % 0xd;
    }
    *r = uVar1;
  }
  if (overflow != (int *)0x0) {
    *overflow = iVar3;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int i;
    int over = 0;
    *r = 0;
    for (i = 0; i < 32; i++) {
        *r = (*r * 0x100) + b32[i];
        if (*r >= EXHAUSTIVE_TEST_ORDER) {
            over = 1;
            *r %= EXHAUSTIVE_TEST_ORDER;
        }
    }
    if (overflow) *overflow = over;
}